

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O1

void __thiscall CodeGenerator::writeProperties(CodeGenerator *this,ostream *s,Class *clazz)

{
  size_type *psVar1;
  pointer pPVar2;
  pointer pcVar3;
  size_type *psVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  pointer pPVar8;
  size_type *local_98;
  string name;
  Property i;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"    // properties",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  pPVar8 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar8 != pPVar2) {
    psVar1 = &i.name._M_string_length;
    do {
      name.field_2._8_8_ = pPVar8->clazz;
      pcVar3 = (pPVar8->name)._M_dataplus._M_p;
      i.clazz = (Class *)psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&i,pcVar3,pcVar3 + (pPVar8->name)._M_string_length);
      i.name.field_2._8_8_ = &i.type._M_string_length;
      pcVar3 = (pPVar8->type)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&i.name.field_2 + 8),pcVar3,
                 pcVar3 + (pPVar8->type)._M_string_length);
      local_98 = &name._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,i.clazz,i.name._M_dataplus._M_p + (long)i.clazz);
      psVar4 = local_98;
      iVar5 = toupper((int)(char)*local_98);
      *(char *)psVar4 = (char)iVar5;
      std::__ostream_insert<char,std::char_traits<char>>(s,"    static rengine::Signal<> on",0x1f);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(char *)local_98,(long)name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Changed;",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    const ",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.name.field_2._8_8_,(long)i.type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," &",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() const {",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        return m_",0x11);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    }",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    void set",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_98,(long)name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(const ",7);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.name.field_2._8_8_,(long)i.type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," &",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") {",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        if (m_",0xe);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," == ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            return;",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        m_",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        on",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_98,(long)name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Changed.emit(this);",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    }",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      plVar7 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      if (local_98 != &name._M_string_length) {
        operator_delete(local_98);
      }
      if ((size_type *)i.name.field_2._8_8_ != &i.type._M_string_length) {
        operator_delete((void *)i.name.field_2._8_8_);
      }
      if (i.clazz != (Class *)psVar1) {
        operator_delete(i.clazz);
      }
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar2);
  }
  return;
}

Assistant:

void CodeGenerator::writeProperties(std::ostream &s, Class *clazz)
{
    s << "    // properties" << std::endl;
    for (auto i : clazz->properties) {
        std::string name = i.name;
        name[0] = std::toupper(name[0]);
        s << "    static rengine::Signal<> on" << name << "Changed;" << std::endl
          << "    const " << i.type << " &" << i.name << "() const {" << std::endl
          << "        return m_" << i.name << ";" << std::endl
          << "    }" << std::endl
          << "    void set" << name << "(const " << i.type << " &" << i.name << ") {" << std::endl
          << "        if (m_" << i.name << " == " << i.name << ")" << std::endl
          << "            return;" << std::endl
          << "        m_" << i.name << " = " << i.name << ";" << std::endl
          << "        on" << name << "Changed.emit(this);" << std::endl
          << "    }" << std::endl
          << std::endl;
    }
}